

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O1

int skiwi::is_number(int *is_real,int *is_scientific,char *value)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  byte bVar4;
  
  bVar4 = *value;
  lVar2 = 0;
  if (bVar4 < 0x2d) {
    if (bVar4 == 0) {
      return 0;
    }
    if (bVar4 != 0x2b) goto LAB_00254e99;
  }
  else {
    if (bVar4 == 0x65) {
      return 0;
    }
    if (bVar4 == 0x45) {
      return 0;
    }
    if (bVar4 != 0x2d) goto LAB_00254e99;
  }
  lVar2 = 1;
  if (value[1] == '\0') {
    return 0;
  }
LAB_00254e99:
  *is_real = 0;
  *is_scientific = 0;
  bVar4 = value[lVar2];
  if (bVar4 != 0) {
    pcVar3 = value + lVar2;
    do {
      if (bVar4 - 0x3a < 0xfffffff6) {
        if ((bVar4 == 0x65) || (bVar4 == 0x45)) {
          if (*is_scientific != 0) {
            return 0;
          }
          *is_scientific = 1;
          *is_real = 1;
          uVar1 = (uint)(byte)pcVar3[1];
          if ((uVar1 == 0x2b) || (uVar1 == 0x2d)) {
            pcVar3 = pcVar3 + 1;
          }
          else if (pcVar3[1] == 0) {
            return uVar1;
          }
          if (pcVar3[1] == '\0') {
            return 0;
          }
        }
        else {
          if (bVar4 != 0x2e) {
            return 0;
          }
          if (*is_real != 0) {
            return 0;
          }
          if (*is_scientific != 0) {
            return 0;
          }
          *is_real = 1;
        }
      }
      bVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (bVar4 != 0);
  }
  return 1;
}

Assistant:

int is_number(int* is_real, int* is_scientific, const char* value)
  {
  if (value[0] == '\0')
    return 0;
  int i = 0;
  if (value[0] == 'e' || value[0] == 'E')
    return 0;
  if (value[0] == '-' || value[0] == '+')
    {
    ++i;
    if (value[1] == '\0')
      return 0;
    }
  *is_real = 0;
  *is_scientific = 0;
  const char* s = value + i;
  while (*s != '\0')
    {
    if (isdigit((unsigned char)(*s)) == 0)
      {
      if ((*s == '.') && (*is_real == 0) && (*is_scientific == 0))
        *is_real = 1;
      else if ((*s == 'e' || *s == 'E') && (*is_scientific == 0))
        {
        *is_scientific = 1;
        *is_real = 1;
        if (*(s + 1) == '\0')
          return 0;
        if (*(s + 1) == '-' || *(s + 1) == '+')
          {
          ++s;
          }
        if (*(s + 1) == '\0')
          return 0;
        }
      else
        return 0;
      }
    ++s;
    }
  return 1;
  }